

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# template_modifiers.cc
# Opt level: O0

ctemplate * __thiscall
ctemplate::PrettyPrintModifiers
          (ctemplate *this,
          vector<const_ctemplate::ModifierAndValue_*,_std::allocator<const_ctemplate::ModifierAndValue_*>_>
          *modvals,string *separator)

{
  bool bVar1;
  reference ppMVar2;
  ctemplate local_70 [48];
  __normal_iterator<const_ctemplate::ModifierAndValue_*const_*,_std::vector<const_ctemplate::ModifierAndValue_*,_std::allocator<const_ctemplate::ModifierAndValue_*>_>_>
  local_40;
  __normal_iterator<const_ctemplate::ModifierAndValue_*const_*,_std::vector<const_ctemplate::ModifierAndValue_*,_std::allocator<const_ctemplate::ModifierAndValue_*>_>_>
  local_38;
  __normal_iterator<const_ctemplate::ModifierAndValue_*const_*,_std::vector<const_ctemplate::ModifierAndValue_*,_std::allocator<const_ctemplate::ModifierAndValue_*>_>_>
  local_30;
  const_iterator it;
  string *separator_local;
  vector<const_ctemplate::ModifierAndValue_*,_std::allocator<const_ctemplate::ModifierAndValue_*>_>
  *modvals_local;
  string *out;
  
  it._M_current._7_1_ = 0;
  std::__cxx11::string::string((string *)this);
  local_30._M_current =
       (ModifierAndValue **)
       std::
       vector<const_ctemplate::ModifierAndValue_*,_std::allocator<const_ctemplate::ModifierAndValue_*>_>
       ::begin(modvals);
  while( true ) {
    local_38._M_current =
         (ModifierAndValue **)
         std::
         vector<const_ctemplate::ModifierAndValue_*,_std::allocator<const_ctemplate::ModifierAndValue_*>_>
         ::end(modvals);
    bVar1 = __gnu_cxx::operator!=(&local_30,&local_38);
    if (!bVar1) break;
    local_40._M_current =
         (ModifierAndValue **)
         std::
         vector<const_ctemplate::ModifierAndValue_*,_std::allocator<const_ctemplate::ModifierAndValue_*>_>
         ::begin(modvals);
    bVar1 = __gnu_cxx::operator!=(&local_30,&local_40);
    if (bVar1) {
      std::__cxx11::string::append((string *)this);
    }
    ppMVar2 = __gnu_cxx::
              __normal_iterator<const_ctemplate::ModifierAndValue_*const_*,_std::vector<const_ctemplate::ModifierAndValue_*,_std::allocator<const_ctemplate::ModifierAndValue_*>_>_>
              ::operator*(&local_30);
    PrettyPrintOneModifier_abi_cxx11_(local_70,*ppMVar2);
    std::__cxx11::string::append((string *)this);
    std::__cxx11::string::~string((string *)local_70);
    __gnu_cxx::
    __normal_iterator<const_ctemplate::ModifierAndValue_*const_*,_std::vector<const_ctemplate::ModifierAndValue_*,_std::allocator<const_ctemplate::ModifierAndValue_*>_>_>
    ::operator++(&local_30);
  }
  return this;
}

Assistant:

string PrettyPrintModifiers(const vector<const ModifierAndValue*>& modvals,
                            const string& separator) {
  string out;
  for (vector<const ModifierAndValue*>::const_iterator it =
           modvals.begin(); it != modvals.end();  ++it) {
    if (it != modvals.begin())
      out.append(separator);
    out.append(PrettyPrintOneModifier(**it));
  }
  return out;
}